

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O1

string * __thiscall
google::(anonymous_namespace)::ReadFileIntoString_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,char *filename)

{
  int iVar1;
  FILE *__stream;
  int *piVar2;
  size_t sVar3;
  string *psVar4;
  char buffer [8092];
  undefined1 auStack_1fd8 [8104];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __stream = fopen((char *)this,"r");
  iVar1 = 0;
  if (__stream == (FILE *)0x0) {
    piVar2 = __errno_location();
    iVar1 = *piVar2;
  }
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  if (iVar1 == 0) {
    while( true ) {
      sVar3 = fread(auStack_1fd8,1,0x1f9c,__stream);
      if (sVar3 == 0) {
        fclose(__stream);
        return __return_storage_ptr__;
      }
      iVar1 = ferror(__stream);
      if (iVar1 != 0) break;
      std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)auStack_1fd8);
    }
    perror((char *)this);
    psVar4 = (string *)(*(code *)gflags_exitfunc)(1);
    return psVar4;
  }
  perror((char *)this);
  psVar4 = (string *)(*(code *)gflags_exitfunc)(1);
  return psVar4;
}

Assistant:

static string ReadFileIntoString(const char* filename) {
  const int kBufSize = 8092;
  char buffer[kBufSize];
  string s;
  FILE* fp;
  if ((errno = SafeFOpen(&fp, filename, "r")) != 0) PFATAL(filename);
  size_t n;
  while ( (n=fread(buffer, 1, kBufSize, fp)) > 0 ) {
    if (ferror(fp))  PFATAL(filename);
    s.append(buffer, n);
  }
  fclose(fp);
  return s;
}